

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StringAggBind
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var2;
  int iVar3;
  undefined8 *puVar4;
  reference pvVar5;
  pointer pEVar6;
  type expr;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  string separator_string;
  Value separator_val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined8 local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118 [2];
  Value local_108;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    puVar4 = (undefined8 *)operator_new(0x28);
    pp_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_108.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_108.type_._0_8_ = pp_Var2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,",","");
    *puVar4 = &PTR__StringAggBindData_024b4d68;
    puVar4[1] = puVar4 + 3;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_108.type_._0_8_ == pp_Var2) {
      puVar4[3] = local_108.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
      puVar4[4] = local_108._24_8_;
    }
    else {
      puVar4[1] = local_108.type_._0_8_;
      puVar4[3] = local_108.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    }
    puVar4[2] = local_108.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined8 **)this = puVar4;
  }
  else {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[6])(pEVar6);
    if ((char)iVar3 != '\0') {
      this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_01);
      __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar6);
    if ((char)iVar3 == '\0') {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      local_108.type_._0_8_ =
           &local_108.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"Separator argument to StringAgg must be a constant","");
      BinderException::BinderException(this_02,(string *)&local_108);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar5);
    ExpressionExecutor::EvaluateScalar(&local_b0,context,expr,false);
    local_128 = local_118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,",","");
    if (local_b0.is_null == true) {
      LogicalType::LogicalType(&local_c8,VARCHAR);
      Value::Value(&local_70,&local_c8);
      this_00._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_108,&local_70);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)this_00._M_head_impl,&local_108);
      Value::~Value(&local_108);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      _Var1._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_00._M_head_impl;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      Value::~Value(&local_70);
      LogicalType::~LogicalType(&local_c8);
    }
    else {
      Value::ToString_abi_cxx11_((string *)&local_108,&local_b0);
      ::std::__cxx11::string::operator=((string *)&local_128,(string *)&local_108);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_108.type_._0_8_ !=
          &local_108.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_108.type_._0_8_);
      }
    }
    Function::EraseArgument
              ((SimpleFunction *)function,arguments,
               ((long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    puVar4 = (undefined8 *)operator_new(0x28);
    pp_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_108.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (local_128 == local_118) {
      local_108._24_8_ = local_118[1]._M_pi;
      local_108.type_._0_8_ = pp_Var2;
    }
    else {
      local_108.type_._0_8_ = local_128;
    }
    local_108.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_ =
         local_118[0]._M_pi._1_7_;
    local_108.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         local_118[0]._M_pi._0_1_;
    *puVar4 = &PTR__StringAggBindData_024b4d68;
    puVar4[1] = puVar4 + 3;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_108.type_._0_8_ == pp_Var2) {
      puVar4[3] = local_108.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
      puVar4[4] = local_108._24_8_;
    }
    else {
      puVar4[1] = local_108.type_._0_8_;
      puVar4[3] = local_108.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    }
    puVar4[2] = local_120;
    *(undefined8 **)this = puVar4;
    local_118[0]._M_pi._0_1_ = 0;
    local_120 = 0;
    local_128 = local_118;
    Value::~Value(&local_b0);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> StringAggBind(ClientContext &context, AggregateFunction &function,
                                       vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() == 1) {
		// single argument: default to comma
		return make_uniq<StringAggBindData>(",");
	}
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw BinderException("Separator argument to StringAgg must be a constant");
	}
	auto separator_val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
	string separator_string = ",";
	if (separator_val.IsNull()) {
		arguments[0] = make_uniq<BoundConstantExpression>(Value(LogicalType::VARCHAR));
	} else {
		separator_string = separator_val.ToString();
	}
	Function::EraseArgument(function, arguments, arguments.size() - 1);
	return make_uniq<StringAggBindData>(std::move(separator_string));
}